

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_cli_req(raft_server *this,req_msg *req)

{
  int *__args_3;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *this_00;
  _func_int **pp_Var1;
  long *plVar2;
  bool bVar3;
  reference pvVar4;
  long lVar5;
  buffer *pbVar6;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  size_t i;
  ulong __n;
  shared_ptr<cornerstone::resp_msg> sVar8;
  undefined1 auVar9 [16];
  ptr<resp_msg> pVar10;
  ptr<resp_msg> *resp;
  int local_4c;
  long local_48;
  element_type *local_40;
  undefined4 local_34;
  
  local_48 = in_RDX;
  bVar3 = is_leader((raft_server *)req);
  __args_3 = (int *)((long)&(req->super_msg_base).term_ + 4);
  if ((bVar3) ||
     (*(int *)&req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 3)) {
    local_40 = ((req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_4c = 4;
    sVar8 = std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int&>
                      ((unsigned_long *)this,(msg_type *)&local_40,&local_4c,__args_3);
    _Var7 = sVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (bVar3) {
      this_00 = (vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 *)(local_48 + 0x38);
      for (__n = 0; __n < (ulong)(*(long *)(local_48 + 0x40) - *(long *)(local_48 + 0x38) >> 4);
          __n = __n + 1) {
        pvVar4 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::at(this_00,__n);
        ((pvVar4->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        term_ = (ulong)((req[3].log_entries_.
                         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
        pp_Var1 = req[4].super_msg_base._vptr_msg_base;
        pvVar4 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::at(this_00,__n);
        (**(code **)(*pp_Var1 + 0x28))(pp_Var1,pvVar4);
        plVar2 = *(long **)&req[4].super_msg_base.type_;
        lVar5 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
        pvVar4 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::at(this_00,__n);
        pbVar6 = log_entry::get_buf((pvVar4->
                                    super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
        pvVar4 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::at(this_00,__n);
        (**(code **)(*plVar2 + 0x18))
                  (plVar2,lVar5 + -1,pbVar6,
                   &((pvVar4->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->cookie_);
      }
      request_append_entries((raft_server *)req);
      pp_Var1 = this->_vptr_raft_server;
      auVar9 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var7._M_pi = auVar9._8_8_;
      pp_Var1[4] = auVar9._0_8_;
      *(undefined1 *)(pp_Var1 + 5) = 1;
    }
  }
  else {
    local_40 = ((req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_4c = 4;
    local_34 = 0xffffffff;
    sVar8 = std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                      ((unsigned_long *)this,(msg_type *)&local_40,&local_4c,__args_3);
    _Var7 = sVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req)
{
    bool leader = is_leader();

    // check if leader has expired.
    // there could be a case that the leader just elected, in that case, client can
    // just simply retry, no safety issue here.
    if (role_ == srv_role::leader && !leader)
    {
        return cs_new<resp_msg>(state_->get_term(), msg_type::append_entries_response, id_, -1);
    }

    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::append_entries_response, id_, leader_));
    if (!leader)
    {
        return resp;
    }

    std::vector<ptr<log_entry>>& entries = req.log_entries();
    for (size_t i = 0; i < entries.size(); ++i)
    {
        // force the log's term to current term
        entries.at(i)->set_term(state_->get_term());

        log_store_->append(entries.at(i));
        state_machine_->pre_commit(log_store_->next_slot() - 1, entries.at(i)->get_buf(), entries.at(i)->get_cookie());
    }

    // urgent commit, so that the commit will not depend on hb
    request_append_entries();
    resp->accept(log_store_->next_slot());
    return resp;
}